

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Opnd.cpp
# Opt level: O1

void IR::Opnd::WriteToBuffer(char16 **buffer,size_t *count,char16 *fmt,...)

{
  char16_t *buffer_00;
  size_t count_00;
  char in_AL;
  int iVar1;
  int *piVar2;
  undefined8 in_RCX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_f8 [24];
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined1 local_48 [8];
  va_list argptr;
  
  argptr[0].overflow_arg_area = local_f8;
  if (in_AL != '\0') {
    local_c8 = in_XMM0_Qa;
    local_b8 = in_XMM1_Qa;
    local_a8 = in_XMM2_Qa;
    local_98 = in_XMM3_Qa;
    local_88 = in_XMM4_Qa;
    local_78 = in_XMM5_Qa;
    local_68 = in_XMM6_Qa;
    local_58 = in_XMM7_Qa;
  }
  argptr[0]._0_8_ = &stack0x00000008;
  local_48._0_4_ = 0x18;
  local_48._4_4_ = 0x30;
  buffer_00 = *buffer;
  count_00 = *count;
  local_e0 = in_RCX;
  local_d8 = in_R8;
  local_d0 = in_R9;
  iVar1 = _vsnwprintf(buffer_00,count_00,fmt,(__va_list_tag *)local_48);
  buffer_00[count_00 - 1] = L'\0';
  if (iVar1 < 0) {
    piVar2 = PAL_errno(0);
    if (*piVar2 == 0) {
      piVar2 = PAL_errno(0);
      *piVar2 = 0x22;
    }
  }
  *count = *count - (long)iVar1;
  *buffer = *buffer + iVar1;
  return;
}

Assistant:

void
Opnd::WriteToBuffer(_Outptr_result_buffer_(*count) char16 **buffer, size_t *count, const char16 *fmt, ...)
{
    va_list argptr;
    va_start(argptr, fmt);

    int len = _vsnwprintf_s(*buffer, *count, _TRUNCATE, fmt, argptr);
    *count -= len;
    *buffer += len;
    va_end(argptr);
}